

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseComma(Parser *this)

{
  CheckedError *ce;
  int in_ESI;
  undefined4 in_register_00000034;
  
  if (*(char *)(CONCAT44(in_register_00000034,in_ESI) + 0x548) == '\0') {
    Expect(this,in_ESI);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109651;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00109651:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseComma() {
  if (!opts.protobuf_ascii_alike) EXPECT(',');
  return NoError();
}